

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xdr.h
# Opt level: O2

_Bool xdr_getuint32(XDR *xdrs,uint32_t *ip)

{
  uint *puVar1;
  uint uVar2;
  _Bool _Var3;
  
  puVar1 = (uint *)((long)xdrs->x_data + 4);
  if ((xdrs->x_v).vio_tail < puVar1) {
    _Var3 = (*xdrs->x_ops->x_getunit)(xdrs,ip);
    return _Var3;
  }
  uVar2 = *(uint *)xdrs->x_data;
  *ip = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  xdrs->x_data = (uint8_t *)puVar1;
  return true;
}

Assistant:

static inline bool
xdr_getuint32(XDR *xdrs, uint32_t *ip)
{
	uint8_t *future = xdrs->x_data + sizeof(uint32_t);

	if (future <= xdrs->x_v.vio_tail) {
		*ip = ntohl(*((uint32_t *) (xdrs->x_data)));
		xdrs->x_data = future;
		return (true);
	}
	return (*xdrs->x_ops->x_getunit)(xdrs, ip);
}